

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall cmNinjaNormalTargetGenerator::Generate(cmNinjaNormalTargetGenerator *this)

{
  TargetType TVar1;
  ulong uVar2;
  string *__rhs;
  cmGeneratorTarget *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  cmNinjaNormalTargetGenerator *local_10;
  cmNinjaNormalTargetGenerator *this_local;
  
  local_10 = this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    WriteLanguagesRules(this);
    cmNinjaTargetGenerator::WriteObjectBuildStatements(&this->super_cmNinjaTargetGenerator);
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    TVar1 = cmGeneratorTarget::GetType(pcVar3);
    if (TVar1 == OBJECT_LIBRARY) {
      WriteObjectLibStatement(this);
    }
    else {
      WriteDeviceLinkStatement(this);
      WriteLinkStatement(this);
    }
    cmNinjaTargetGenerator::AdditionalCleanFiles(&this->super_cmNinjaTargetGenerator);
  }
  else {
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    __rhs = cmGeneratorTarget::GetName_abi_cxx11_(pcVar3);
    std::operator+(&local_30,"CMake can not determine linker language for target: ",__rhs);
    cmSystemTools::Error(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::Generate()
{
  if (this->TargetLinkLanguage.empty()) {
    cmSystemTools::Error("CMake can not determine linker language for "
                         "target: " +
                         this->GetGeneratorTarget()->GetName());
    return;
  }

  // Write the rules for each language.
  this->WriteLanguagesRules();

  // Write the build statements
  this->WriteObjectBuildStatements();

  if (this->GetGeneratorTarget()->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    this->WriteObjectLibStatement();
  } else {
    // If this target has cuda language link inputs, and we need to do
    // device linking
    this->WriteDeviceLinkStatement();
    this->WriteLinkStatement();
  }

  this->AdditionalCleanFiles();
}